

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall SubcommandProgram_Groups_Test::TestBody(SubcommandProgram_Groups_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  App *pAVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  string help;
  string local_268;
  char local_248 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  AssertHelper local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  App *local_1f8;
  string local_1f0;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pAVar2 = &(this->super_SubcommandProgram).super_TApp.app;
  pcVar4 = "";
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
  local_1f8 = pAVar2;
  CLI::App::help(&local_1f0,pAVar2,0x1e,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"More Commands:","");
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_218,local_218 + local_210);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_110,local_110 + local_108);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_f0,local_f0 + local_e8);
  local_238[0].data_ = (AssertHelperData *)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(local_248,(char *)local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1580c7);
  if (local_238[0].data_ != (AssertHelperData *)local_228) {
    operator_delete(local_238[0].data_);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_248[0] == '\0') {
    testing::Message::Message((Message *)&local_268);
    if (local_240.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x22a,pcVar4);
    testing::internal::AssertHelper::operator=(local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
      local_268._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Subcommands:","");
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_218,local_218 + local_210);
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_130,local_130 + local_128);
  local_238[0].data_ = (AssertHelperData *)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_248,(char *)local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1580c7);
  if (local_238[0].data_ != (AssertHelperData *)local_228) {
    operator_delete(local_238[0].data_);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_248[0] == '\0') {
    testing::Message::Message((Message *)&local_268);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x22b,pcVar4);
    testing::internal::AssertHelper::operator=(local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
      local_268._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar2 = (this->super_SubcommandProgram).start;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"More Commands","");
  std::__cxx11::string::_M_assign((string *)&pAVar2->group_);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  pcVar4 = "";
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  CLI::App::help(&local_268,local_1f8,0x1e,&local_90);
  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"More Commands:","");
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_218,local_218 + local_210);
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_150,local_150 + local_148);
  local_238[0].data_ = (AssertHelperData *)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_248,(char *)local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1580c7);
  if (local_238[0].data_ != (AssertHelperData *)local_228) {
    operator_delete(local_238[0].data_);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_248[0] == '\0') {
    testing::Message::Message((Message *)&local_268);
    if (local_240.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x22f,pcVar4);
    testing::internal::AssertHelper::operator=(local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
      local_268._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Subcommands:","");
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_218,local_218 + local_210);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_170,local_170 + local_168);
  local_238[0].data_ = (AssertHelperData *)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_248,(char *)local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1580c7);
  if (local_238[0].data_ != (AssertHelperData *)local_228) {
    operator_delete(local_238[0].data_);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_248[0] == '\0') {
    testing::Message::Message((Message *)&local_268);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x230,pcVar4);
    testing::internal::AssertHelper::operator=(local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
      local_268._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar2 = (this->super_SubcommandProgram).stop;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"more commands","");
  std::__cxx11::string::_M_assign((string *)&pAVar2->group_);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  pcVar4 = "";
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"","");
  CLI::App::help(&local_268,local_1f8,0x1e,&local_d0);
  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"More Commands:","");
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_218,local_218 + local_210);
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_190,local_190 + local_188);
  local_238[0].data_ = (AssertHelperData *)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_248,(char *)local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1580c7);
  if (local_238[0].data_ != (AssertHelperData *)local_228) {
    operator_delete(local_238[0].data_);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_248[0] == '\0') {
    testing::Message::Message((Message *)&local_268);
    if (local_240.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x235,pcVar4);
    testing::internal::AssertHelper::operator=(local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
      local_268._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Subcommands:","");
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_218,local_218 + local_210);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_1d0,local_1d0 + local_1c8);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_1b0,local_1b0 + local_1a8);
  local_238[0].data_ = (AssertHelperData *)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(local_248,(char *)local_238,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1580c7);
  if (local_238[0].data_ != (AssertHelperData *)local_228) {
    operator_delete(local_238[0].data_);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_248[0] == '\0') {
    testing::Message::Message((Message *)&local_268);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x236,pcVar4);
    testing::internal::AssertHelper::operator=(local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
      local_268._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(SubcommandProgram, Groups) {

    std::string help = app.help();
    EXPECT_THAT(help, Not(HasSubstr("More Commands:")));
    EXPECT_THAT(help, HasSubstr("Subcommands:"));

    start->group("More Commands");
    help = app.help();
    EXPECT_THAT(help, HasSubstr("More Commands:"));
    EXPECT_THAT(help, HasSubstr("Subcommands:"));

    // Case is ignored but for the first subcommand in a group.
    stop->group("more commands");
    help = app.help();
    EXPECT_THAT(help, HasSubstr("More Commands:"));
    EXPECT_THAT(help, Not(HasSubstr("Subcommands:")));
}